

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsLoadFS::Read<tcu::Vector<float,4>>
          (BasicAllFormatsLoadFS *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value,GLenum format,GLenum type)

{
  uint uVar1;
  GLenum GVar2;
  GLenum GVar3;
  bool bVar4;
  GLuint GVar5;
  char *src_fs;
  reference pixels;
  reference pixels_00;
  reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  string local_178;
  Vector<float,_4> local_158;
  string local_148;
  Vector<float,_4> local_128;
  string local_118;
  uint local_f4;
  void *pvStack_f0;
  int i;
  Vector<float,_4> *map_data;
  GLuint m_buffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data;
  GLuint unit;
  GLuint texture;
  ShortByteData<tcu::Vector<float,_4>_> d;
  int kSize;
  string local_68;
  GLuint local_44;
  char *pcStack_40;
  GLuint program;
  char *src_vs;
  GLenum type_local;
  GLenum format_local;
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *value_local;
  BasicAllFormatsLoadFS *pBStack_18;
  GLenum internalformat_local;
  BasicAllFormatsLoadFS *this_local;
  
  pcStack_40 = 
  "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}";
  src_vs._0_4_ = type;
  src_vs._4_4_ = format;
  _type_local = expected_value;
  expected_value_local = value;
  value_local._4_4_ = internalformat;
  pBStack_18 = this;
  GenFS<tcu::Vector<float,4>>(&local_68,this,internalformat,expected_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar5 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,src_fs,false,false);
  std::__cxx11::string::~string((string *)&local_68);
  d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xb;
  local_44 = GVar5;
  glcts::anon_unknown_0::ShortByteData<tcu::Vector<float,_4>_>::ShortByteData
            ((ShortByteData<tcu::Vector<float,_4>_> *)&unit,0xb,expected_value_local,
             value_local._4_4_,src_vs._4_4_);
  glu::CallLogWrapper::glGenTextures
            ((CallLogWrapper *)(this + 8),1,
             (GLuint *)
             ((long)&out_data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  out_data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  glu::CallLogWrapper::glBindTexture
            ((CallLogWrapper *)(this + 8),0xde1,
             out_data.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D
            ((CallLogWrapper *)(this + 8),0xde1,1,value_local._4_4_,0xb,0xb);
  bVar4 = glcts::anon_unknown_0::Shorts(value_local._4_4_);
  GVar3 = src_vs._4_4_;
  GVar2 = (GLenum)src_vs;
  if (bVar4) {
    pixels = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)
                        &d.data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    glu::CallLogWrapper::glTexSubImage2D
              ((CallLogWrapper *)(this + 8),0xde1,0,0,0,0xb,0xb,GVar3,GVar2,pixels);
  }
  else {
    bVar4 = glcts::anon_unknown_0::Bytes(value_local._4_4_);
    GVar3 = src_vs._4_4_;
    GVar2 = (GLenum)src_vs;
    if (bVar4) {
      pixels_00 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                            ((vector<signed_char,_std::allocator<signed_char>_> *)
                             &d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,0);
      glu::CallLogWrapper::glTexSubImage2D
                ((CallLogWrapper *)(this + 8),0xde1,0,0,0,0xb,0xb,GVar3,GVar2,pixels_00);
    }
    else {
      pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &unit,0);
      glu::CallLogWrapper::glTexSubImage2D
                ((CallLogWrapper *)(this + 8),0xde1,0,0,0,0xb,0xb,GVar3,GVar2,pvVar6);
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0xb,0xb);
  glu::CallLogWrapper::glClear((CallLogWrapper *)(this + 8),0x4000);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_44);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),
             (GLuint)out_data.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
             out_data.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,'\0',0,35000,
             value_local._4_4_);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&m_buffer,
             0x79,(allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&map_data + 7));
  glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,0,(GLuint)map_data);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      &m_buffer,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x790,pvVar6,0x88e4);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x200);
  pvStack_f0 = glu::CallLogWrapper::glMapBufferRange((CallLogWrapper *)(this + 8),0x90d2,0,0x790,1);
  local_f4 = 0;
  do {
    if (0x78 < (int)local_f4) {
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_44);
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)(this + 8),1,
                 (GLuint *)
                 ((long)&out_data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
      this_local._7_1_ = 1;
LAB_0146fe0e:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&m_buffer
                );
      glcts::anon_unknown_0::ShortByteData<tcu::Vector<float,_4>_>::~ShortByteData
                ((ShortByteData<tcu::Vector<float,_4>_> *)&unit);
      return (bool)(this_local._7_1_ & 1);
    }
    bVar4 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                      ((ShaderImageLoadStoreBase *)this,
                       (vec4 *)((long)pvStack_f0 + (long)(int)local_f4 * 0x10),_type_local,
                       value_local._4_4_);
    uVar1 = local_f4;
    if (!bVar4) {
      tcu::Vector<float,_4>::Vector
                (&local_128,(Vector<float,_4> *)((long)pvStack_f0 + (long)(int)local_f4 * 0x10));
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&local_118,(ShaderImageLoadStoreBase *)this,&local_128);
      uVar7 = std::__cxx11::string::c_str();
      tcu::Vector<float,_4>::Vector(&local_158,_type_local);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                (&local_148,(ShaderImageLoadStoreBase *)this,&local_158);
      uVar8 = std::__cxx11::string::c_str();
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_178,(ShaderImageLoadStoreBase *)this,value_local._4_4_);
      uVar9 = std::__cxx11::string::c_str();
      glcts::anon_unknown_0::Output
                ("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",
                 (ulong)uVar1,uVar7,uVar8,uVar9,
                 (ulong)(GLuint)out_data.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_118);
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_44);
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)(this + 8),1,
                 (GLuint *)
                 ((long)&out_data.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),1,(GLuint *)&map_data);
      this_local._7_1_ = 0;
      goto LAB_0146fe0e;
    }
    local_f4 = local_f4 + 1;
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value, GLenum format, GLenum type)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		GLuint			 program = BuildProgram(src_vs, GenFS(internalformat, expected_value).c_str());
		const int		 kSize   = 11;
		ShortByteData<T> d(kSize, value, internalformat, format);
		GLuint			 texture;
		glGenTextures(1, &texture);
		GLuint unit = 1;
		glBindTexture(GL_TEXTURE_2D, texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		if (Shorts(internalformat))
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datas[0]);
		else if (Bytes(internalformat))
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datab[0]);
		else
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glViewport(0, 0, kSize, kSize);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(program);
		glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindVertexArray(m_vao);

		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n", i,
					   ToString(map_data[i]).c_str(), ToString(expected_value).c_str(),
					   FormatEnumToString(internalformat).c_str(), unit);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteTextures(1, &texture);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(1, &texture);
		glDeleteBuffers(1, &m_buffer);
		return true;
	}